

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmLocalNinjaGenerator::Generate(cmLocalNinjaGenerator *this)

{
  string *__lhs;
  cmMakefile *this_00;
  cmGlobalGenerator *this_01;
  bool bVar1;
  TargetType TVar2;
  char *pcVar3;
  ostream *poVar4;
  cmNinjaTargetGenerator *pcVar5;
  _Alloc_hider _Var6;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  allocator local_7a;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  pcVar3 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&local_78,pcVar3,&local_7a);
  pcVar3 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&local_38,pcVar3,&local_79);
  cmOutputConverter::ConvertToRelativePath
            (&local_58,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &local_78,&local_38);
  __lhs = &this->HomeRelativeOutputPath;
  std::__cxx11::string::operator=((string *)__lhs,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = std::operator==(__lhs,".");
  if (bVar1) {
    std::__cxx11::string::assign((char *)__lhs);
  }
  WriteProcessedMakefile
            (this,(ostream *)
                  (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                  _vptr_cmGlobalGenerator);
  bVar1 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
  if (bVar1) {
    WriteBuildFileTop(this);
    WritePools(this,*(ostream **)
                     &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1]
                      .TryCompileTimeout);
    this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::__cxx11::string::string
              ((string *)&local_78,"CMAKE_CL_SHOWINCLUDES_PREFIX",(allocator *)&local_38);
    pcVar3 = cmMakefile::GetSafeDefinition(this_00,&local_78);
    std::__cxx11::string::string((string *)&local_58,pcVar3,&local_7a);
    std::__cxx11::string::~string((string *)&local_78);
    if ((pointer)local_58._M_string_length != (pointer)0x0) {
      poVar4 = *(ostream **)
                &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                 TryCompileTimeout;
      std::__cxx11::string::string
                ((string *)&local_78,"localized /showIncludes string",(allocator *)&local_38);
      cmGlobalNinjaGenerator::WriteComment(poVar4,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      poVar4 = std::operator<<(*(ostream **)
                                &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                                 GlobalGenerator[1].TryCompileTimeout,"msvc_deps_prefix = ");
      poVar4 = std::operator<<(poVar4,(string *)&local_58);
      std::operator<<(poVar4,"\n\n");
    }
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_58,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets);
  for (_Var6._M_p = local_58._M_dataplus._M_p; _Var6._M_p != (pointer)local_58._M_string_length;
      _Var6._M_p = _Var6._M_p + 8) {
    TVar2 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)_Var6._M_p);
    if (TVar2 != INTERFACE_LIBRARY) {
      pcVar5 = cmNinjaTargetGenerator::New(*(cmGeneratorTarget **)_Var6._M_p);
      if (pcVar5 != (cmNinjaTargetGenerator *)0x0) {
        (*(pcVar5->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[3])(pcVar5);
        this_01 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
        bVar1 = cmGlobalGenerator::IsExcluded
                          (this_01,*(this_01->LocalGenerators).
                                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                           *(cmGeneratorTarget **)_Var6._M_p);
        if (!bVar1) {
          cmGlobalNinjaGenerator::AddDependencyToAll
                    ((cmGlobalNinjaGenerator *)
                     (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                     *(cmGeneratorTarget **)_Var6._M_p);
        }
        (*(pcVar5->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[1])(pcVar5);
      }
    }
  }
  WriteCustomCommandBuildStatements(this);
  std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
            ((_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&local_58);
  return;
}

Assistant:

void cmLocalNinjaGenerator::Generate()
{
  // Compute the path to use when referencing the current output
  // directory from the top output directory.
  this->HomeRelativeOutputPath = this->ConvertToRelativePath(
    this->GetBinaryDirectory(), this->GetCurrentBinaryDirectory());
  if (this->HomeRelativeOutputPath == ".") {
    this->HomeRelativeOutputPath = "";
  }

  this->WriteProcessedMakefile(this->GetBuildFileStream());
#ifdef NINJA_GEN_VERBOSE_FILES
  this->WriteProcessedMakefile(this->GetRulesFileStream());
#endif

  // We do that only once for the top CMakeLists.txt file.
  if (this->IsRootMakefile()) {
    this->WriteBuildFileTop();

    this->WritePools(this->GetRulesFileStream());

    const std::string showIncludesPrefix =
      this->GetMakefile()->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
    if (!showIncludesPrefix.empty()) {
      cmGlobalNinjaGenerator::WriteComment(this->GetRulesFileStream(),
                                           "localized /showIncludes string");
      this->GetRulesFileStream() << "msvc_deps_prefix = " << showIncludesPrefix
                                 << "\n\n";
    }
  }

  std::vector<cmGeneratorTarget*> targets = this->GetGeneratorTargets();
  for (std::vector<cmGeneratorTarget*>::iterator t = targets.begin();
       t != targets.end(); ++t) {
    if ((*t)->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    cmNinjaTargetGenerator* tg = cmNinjaTargetGenerator::New(*t);
    if (tg) {
      tg->Generate();
      // Add the target to "all" if required.
      if (!this->GetGlobalNinjaGenerator()->IsExcluded(
            this->GetGlobalNinjaGenerator()->GetLocalGenerators()[0], *t)) {
        this->GetGlobalNinjaGenerator()->AddDependencyToAll(*t);
      }
      delete tg;
    }
  }

  this->WriteCustomCommandBuildStatements();
}